

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O3

void __thiscall
CLogicSocket::procPingTimeOutChecking(CLogicSocket *this,LPSTRUC_MSG_HEADER tmpmsg,time_t cur_time)

{
  lp_connection_t p_Conn_00;
  CMemory *this_00;
  lp_connection_t p_Conn;
  SourceFile file;
  Logger local_1000;
  
  this_00 = CMemory::GetInstance();
  p_Conn_00 = tmpmsg->pConn;
  if (tmpmsg->iCurrsequence == p_Conn_00->iCurrsequence) {
    if ((long)(this->super_CSocekt).m_iWaitTime * 3 + 10 < cur_time - p_Conn_00->lastPingTime) {
      if (muduo::g_logLevel < 3) {
        file._8_8_ = 0xd;
        file.data_ = "flyd_logic.cc";
        muduo::Logger::Logger(&local_1000,file,0x115);
        if (0x25 < (uint)(((int)&local_1000 + 0xfb8) - (int)local_1000.impl_.stream_.buffer_.cur_))
        {
          builtin_strncpy(local_1000.impl_.stream_.buffer_.cur_,
                          "时间到不发心跳包，踢出去!",0x25);
          local_1000.impl_.stream_.buffer_.cur_ = local_1000.impl_.stream_.buffer_.cur_ + 0x25;
        }
        muduo::Logger::~Logger(&local_1000);
      }
      CSocekt::zdClosesocketProc(&this->super_CSocekt,p_Conn_00);
    }
    CMemory::FreeMemory(this_00,tmpmsg);
    return;
  }
  CMemory::FreeMemory(this_00,tmpmsg);
  return;
}

Assistant:

void CLogicSocket::procPingTimeOutChecking(LPSTRUC_MSG_HEADER tmpmsg,time_t cur_time)
{
    CMemory *p_memory = CMemory::GetInstance();

    if(tmpmsg->iCurrsequence == tmpmsg->pConn->iCurrsequence) //此连接没断
    {
        lp_connection_t p_Conn = tmpmsg->pConn;

        //超时踢的判断标准就是 每次检查的时间间隔*3，超过这个时间没发送心跳包，就踢【大家可以根据实际情况自由设定】
        if( (cur_time - p_Conn->lastPingTime ) > (m_iWaitTime * 3 + 10) )
        {
            //踢出去【如果此时此刻该用户正好断线，则这个socket可能立即被后续上来的连接复用  如果真有人这么倒霉，赶上这个点了，那么可能错踢，错踢就错踢】            
            LOG_INFO << "时间到不发心跳包，踢出去!";   //感觉OK
            zdClosesocketProc(p_Conn); 
        }   
             
        p_memory->FreeMemory(tmpmsg);//内存要释放
    }
    else //此连接断了
    {
        p_memory->FreeMemory(tmpmsg);//内存要释放
    }
    return;
}